

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SliderScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_min,void *p_max,
                        char *format,ImGuiSliderFlags flags)

{
  float text_baseline_y;
  ImGuiWindow *this;
  ImDrawList *this_00;
  ImVec2 pos;
  ImVec2 IVar1;
  ImVec2 p_max_00;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 IVar4;
  int iVar5;
  byte bVar6;
  ImGuiCol idx;
  byte bVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  char *local_f8;
  ImRect frame_bb;
  ImRect grab_bb;
  ImVec2 local_90;
  ImRect total_bb;
  char value_buf [64];
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  fVar9 = CalcItemWidth();
  IVar1 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar10 = IVar1.x;
  text_baseline_y = (pIVar2->Style).FramePadding.y;
  frame_bb.Min.x = (this->DC).CursorPos.x;
  frame_bb.Min.y = (this->DC).CursorPos.y;
  frame_bb.Max.x = fVar9 + frame_bb.Min.x;
  frame_bb.Max.y = text_baseline_y + text_baseline_y + IVar1.y + frame_bb.Min.y;
  fVar9 = 0.0;
  if (0.0 < fVar10) {
    fVar9 = (pIVar2->Style).ItemInnerSpacing.x + fVar10;
  }
  total_bb.Max.x = fVar9 + frame_bb.Max.x;
  total_bb.Max.y = frame_bb.Max.y + 0.0;
  uVar8 = flags & 0x80;
  total_bb.Min.x = frame_bb.Min.x;
  total_bb.Min.y = frame_bb.Min.y;
  ItemSize(&total_bb,text_baseline_y);
  bVar3 = ItemAdd(&total_bb,id,&frame_bb,uVar8 * 2 ^ 0x100);
  if (!bVar3) {
    return false;
  }
  if (format == (char *)0x0) {
    local_f8 = GDataTypeInfo[data_type].PrintFmt;
  }
  else {
    local_f8 = format;
    if ((data_type == 4) && (((*format != '%' || (format[1] != 'd')) || (format[2] != '\0')))) {
      local_f8 = PatchFormatStringFloatToInt(format);
    }
  }
  bVar3 = ItemHoverable(&frame_bb,id);
  if (uVar8 == 0) {
    if ((GImGui->ActiveId == id) && (GImGui->TempInputId == id)) goto LAB_0015ec94;
    bVar7 = *(byte *)((long)&(pIVar2->LastItemData).StatusFlags + 1) & 1;
  }
  else {
    bVar7 = 0;
  }
  if (bVar3) {
    bVar6 = (pIVar2->IO).MouseClicked[0];
  }
  else {
    bVar6 = 0;
  }
  if (((bVar7 != 0 || (bVar6 & 1) != 0) || (pIVar2->NavActivateId == id)) ||
     (pIVar2->NavActivateInputId == id)) {
    SetActiveID(id,this);
    SetFocusID(id,this);
    FocusWindow(this);
    *(byte *)&pIVar2->ActiveIdUsingNavDirMask = (byte)pIVar2->ActiveIdUsingNavDirMask | 3;
    if ((uVar8 == 0) &&
       ((bVar7 != 0 ||
        (((bVar6 != 0 && ((pIVar2->IO).KeyCtrl != false)) || (pIVar2->NavActivateInputId == id))))))
    {
LAB_0015ec94:
      if ((flags & 0x10U) == 0) {
        p_max = (void *)0x0;
        p_min = (void *)0x0;
      }
      bVar3 = TempInputScalar(&frame_bb,id,label,data_type,p_data,local_f8,p_min,p_max);
      return bVar3;
    }
  }
  idx = 9;
  if (pIVar2->ActiveId != id) {
    idx = bVar3 + 7;
  }
  IVar4 = GetColorU32(idx,1.0);
  RenderNavHighlight(&frame_bb,id,1);
  IVar1.y = frame_bb.Min.y;
  IVar1.x = frame_bb.Min.x;
  p_max_00.y = frame_bb.Max.y;
  p_max_00.x = frame_bb.Max.x;
  RenderFrame(IVar1,p_max_00,IVar4,true,(pIVar2->Style).FrameRounding);
  grab_bb.Min.x = 0.0;
  grab_bb.Min.y = 0.0;
  grab_bb.Max.x = 0.0;
  grab_bb.Max.y = 0.0;
  bVar3 = SliderBehavior(&frame_bb,id,data_type,p_data,p_min,p_max,local_f8,flags,&grab_bb);
  if (bVar3) {
    MarkItemEdited(id);
  }
  if (grab_bb.Min.x < grab_bb.Max.x) {
    this_00 = this->DrawList;
    IVar4 = GetColorU32((pIVar2->ActiveId == id) + 0x13,1.0);
    ImDrawList::AddRectFilled
              (this_00,&grab_bb.Min,&grab_bb.Max,IVar4,(pIVar2->Style).GrabRounding,0);
  }
  iVar5 = DataTypeFormatString(value_buf,0x40,data_type,p_data,local_f8);
  if (pIVar2->LogEnabled == true) {
    LogSetNextTextDecoration("{","}");
  }
  local_90.x = 0.5;
  local_90.y = 0.5;
  RenderTextClipped(&frame_bb.Min,&frame_bb.Max,value_buf,value_buf + iVar5,(ImVec2 *)0x0,&local_90,
                    (ImRect *)0x0);
  if (0.0 < fVar10) {
    pos.y = (pIVar2->Style).FramePadding.y + frame_bb.Min.y;
    pos.x = (pIVar2->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    RenderText(pos,label,(char *)0x0,true);
    return bVar3;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}